

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::MultiTransformNode::calculateStatistics
          (MultiTransformNode *this,Statistics *stat)

{
  size_type sVar1;
  reference pvVar2;
  long in_RSI;
  long in_RDI;
  size_t i;
  ulong local_40;
  
  *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
  if (*(long *)(in_RDI + 0x50) == 1) {
    (**(code **)(**(long **)(in_RDI + 0x80) + 0x48))(*(long **)(in_RDI + 0x80),in_RSI);
    for (local_40 = 0;
        sVar1 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)(in_RDI + 0x68)), local_40 < sVar1; local_40 = local_40 + 1) {
      *(long *)(in_RSI + 0x90) = *(long *)(in_RSI + 0x90) + 1;
      if (*(long *)(*(long *)(in_RDI + 0x80) + 0x50) == 1) {
        *(long *)(in_RSI + 0x98) = *(long *)(in_RSI + 0x98) + 1;
      }
      pvVar2 = std::
               vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
               ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                             *)(in_RDI + 0x68),local_40);
      if (1 < (pvVar2->spaces).size_active) {
        (**(code **)(**(long **)(in_RDI + 0x80) + 0x48))(*(long **)(in_RDI + 0x80),in_RSI);
      }
    }
  }
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::calculateStatistics(Statistics& stat)
  {
    indegree++;
    if (indegree == 1)
    {
      child->calculateStatistics(stat);

      for (size_t i = 0; i < spaces.size(); ++i) {
        stat.numTransformNodes++;
        if (child->indegree == 1)
          stat.numTransformedObjects++;

        if (spaces[i].size() > 1) child->calculateStatistics(stat); // break instance up when motion blur is used
      }
    }
  }